

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecaySpectrum.test.cpp
# Opt level: O2

void verifyChunkWithLCONTwo(DecaySpectrum *chunk)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef macroName_99;
  StringRef macroName_x00100;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  StringRef capturedExpression_99;
  StringRef capturedExpression_x00100;
  array<double,_2UL> aVar4;
  AssertionHandler catchAssertionHandler_79;
  undefined1 local_128 [8];
  undefined8 local_120;
  ITransientExpression *local_118;
  char *local_110 [2];
  double local_100;
  ITransientExpression local_f0;
  double *local_e0;
  WithinRelMatcher *local_d8;
  ContinuousSpectrum continuous;
  double local_40;
  TabulationRecord *local_38;
  
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x12;
  capturedExpression.m_start = "0. == chunk.STYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName,(SourceLineInfo *)&catchAssertionHandler_79,
             capturedExpression,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       (chunk->data_).metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
       .super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b1;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1b;
  capturedExpression_00.m_start = "0. == chunk.radiationType()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_00,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_00,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       (chunk->data_).metadata.fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
       .super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b3;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "2 == chunk.LCON()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_01,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_01,ContinueOnFailure);
  iVar3 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 2,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b4;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x1d;
  capturedExpression_02.m_start = "2 == chunk.spectralTypeFlag()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_02,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_02,ContinueOnFailure);
  iVar3 = (int)(chunk->data_).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 2,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b5;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x11;
  capturedExpression_03.m_start = "0 == chunk.LCOV()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_03,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_03,ContinueOnFailure);
  iVar3 = (int)((_Head_base<3UL,_long,_false> *)
               ((long)&(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 0,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       catchAssertionHandler_79.m_assertionInfo.macroName.m_size & 0xffffffff;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b6;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x1b;
  capturedExpression_04.m_start = "0 == chunk.covarianceFlag()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_04,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_04,ContinueOnFailure);
  iVar3 = (int)((_Head_base<3UL,_long,_false> *)
               ((long)&(chunk->data_).metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<2UL,_long,_long,_long,_long>.
                       super__Tuple_impl<3UL,_long,_long,_long> + 0x10))->_M_head_impl;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 0,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       catchAssertionHandler_79.m_assertionInfo.macroName.m_size & 0xffffffff;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b7;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "2 == chunk.NER()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_05,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_05,ContinueOnFailure);
  iVar3 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 2,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1b8;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x22;
  capturedExpression_06.m_start = "2 == chunk.numberDiscreteSpectra()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_06,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_06,ContinueOnFailure);
  iVar3 = *(int *)&(chunk->data_).metadata.fields.
                   super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                   super__Tuple_impl<2UL,_long,_long,_long,_long>.
                   super__Tuple_impl<3UL,_long,_long,_long>;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 2,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ba;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x1e;
  capturedExpression_07.m_start = "1., WithinRel( chunk.FD()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_07,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_07,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._1_1_ = bVar2;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1bb;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x1e;
  capturedExpression_08.m_start = "0., WithinRel( chunk.FD()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_08,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_08,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1bc;
  macroName_09.m_size = 10;
  macroName_09.m_start = "CHECK_THAT";
  capturedExpression_09.m_size = 0x37;
  capturedExpression_09.m_start = "1., WithinRel( chunk.discreteNormalisationFactor()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_09,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_09,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             *(chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1bd;
  macroName_10.m_size = 10;
  macroName_10.m_start = "CHECK_THAT";
  capturedExpression_10.m_size = 0x37;
  capturedExpression_10.m_start = "0., WithinRel( chunk.discreteNormalisationFactor()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_10,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_10,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1be;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x1f;
  capturedExpression_11.m_start = "0.5, WithinRel( chunk.FC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_11,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_11,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1bf;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x20;
  capturedExpression_12.m_start = "0.25, WithinRel( chunk.FC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_12,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_12,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fd0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c0;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x3a;
  capturedExpression_13.m_start = "0.5, WithinRel( chunk.continuousNormalisationFactor()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_13,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_13,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[4]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c1;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x3b;
  capturedExpression_14.m_start = "0.25, WithinRel( chunk.continuousNormalisationFactor()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_14,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_14,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fd0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[5]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c2;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x29;
  capturedExpression_15.m_start = "2.107044e+2, WithinRel( chunk.ERAV()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_15,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_15,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x406a568a71de69ad;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c3;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x29;
  capturedExpression_16.m_start = "1.576284e+1, WithinRel( chunk.ERAV()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_16,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_16,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x402f8692f6e8294a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c4;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x37;
  capturedExpression_17.m_start = "2.107044e+2, WithinRel( chunk.averageDecayEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_17,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_17,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x406a568a71de69ad;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c5;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x37;
  capturedExpression_18.m_start = "1.576284e+1, WithinRel( chunk.averageDecayEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_18,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_18,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x402f8692f6e8294a;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             (chunk->data_).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[3]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1c7;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x2a;
  capturedExpression_19.m_start = "std::nullopt != chunk.continuousSpectrum()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_19,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_19,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)&chunk->continuous_;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((chunk->continuous_).
                super__Optional_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_false,_false>
                ._M_payload.
                super__Optional_payload<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum,_true,_false,_false>
                .
                super__Optional_payload_base<njoy::ENDFtk::section::Type<8,_457>::ContinuousSpectrum>
                ._M_engaged,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df360;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_2c98e;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  local_38 = (TabulationRecord *)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ca;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x18;
  capturedExpression_20.m_start = "3. == discrete[0].RTYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_20,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_20,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       *(((chunk->discrete_).
          super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 3.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x4008000000000000;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1cb;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x1e;
  capturedExpression_21.m_start = "3. == discrete[0].decayChain()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_21,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_21,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       *(((chunk->discrete_).
          super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 3.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x4008000000000000;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1cc;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x16;
  capturedExpression_22.m_start = "12 == discrete[0].NT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_22,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_22,ContinueOnFailure);
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)*(pointer *)
                               ((long)&(pDVar1->super_ListRecord).data.
                                       super__Vector_base<double,_std::allocator<double>_> + 8) -
                       *(long *)&(pDVar1->super_ListRecord).data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data) >> 3);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 0xc,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(0xc,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1cd;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x2d;
  capturedExpression_23.m_start = "4.863000e+4, WithinRel( discrete[0].ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_23,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_23,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40e7bec000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((chunk->discrete_).
                       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ce;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x2d;
  capturedExpression_24.m_start = "5.000000e+1, WithinRel( discrete[0].ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_24,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_24,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4049000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(((chunk->discrete_).
                       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x20))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1cf;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x39;
  capturedExpression_25.m_start = "4.863000e+4, WithinRel( discrete[0].discreteEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_25,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_25,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40e7bec000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(((chunk->discrete_).
                       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x28))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d0;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x39;
  capturedExpression_26.m_start = "5.000000e+1, WithinRel( discrete[0].discreteEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_26,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_26,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4049000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(((chunk->discrete_).
                       super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).metadata.fields
             + 0x20))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d1;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x2d;
  capturedExpression_27.m_start = "1.420112e-6, WithinRel( discrete[0].RI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_27,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_27,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3eb7d355a82063d2;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d2;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x2d;
  capturedExpression_28.m_start = "2.85306e-10, WithinRel( discrete[0].RI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_28,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_28,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3df39b27fecb19b6;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d3;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x3c;
  capturedExpression_29.m_start = "1.420112e-6, WithinRel( discrete[0].relativeIntensity()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_29,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_29,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3eb7d355a82063d2;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d4;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x3c;
  capturedExpression_30.m_start = "2.85306e-10, WithinRel( discrete[0].relativeIntensity()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_30,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_30,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3df39b27fecb19b6;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d5;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x18;
  capturedExpression_31.m_start = "0. == discrete[0].TYPE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_31,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_31,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       *(size_type *)
        (*(long *)&(((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d6;
  macroName_32.m_size = 5;
  macroName_32.m_start = "CHECK";
  capturedExpression_32.m_size = 0x18;
  capturedExpression_32.m_start = "0. == discrete[0].type()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_32,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_32,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       *(size_type *)
        (*(long *)&(((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d7;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x26;
  capturedExpression_33.m_start = "0.0, WithinRel( discrete[0].RIS()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_33,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_33,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d8;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x26;
  capturedExpression_34.m_start = "0.0, WithinRel( discrete[0].RIS()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_34,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_34,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1d9;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x43;
  capturedExpression_35.m_start =
       "0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_35,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_35,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1da;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x43;
  capturedExpression_36.m_start =
       "0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_36,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_36,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1db;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x2f;
  capturedExpression_37.m_start = "7.010000e+5, WithinRel( discrete[0].RICC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_37,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_37,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4125649000000000;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1dc;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x2f;
  capturedExpression_38.m_start = "1.106180e-2, WithinRel( discrete[0].RICC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_38,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_38,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f86a791a9e10f7a;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1dd;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x4d;
  capturedExpression_39.m_start =
       "7.010000e+5, WithinRel( discrete[0].totalInternalConversionCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_39,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_39,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4125649000000000;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1de;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x4d;
  capturedExpression_40.m_start =
       "1.106180e-2, WithinRel( discrete[0].totalInternalConversionCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_40,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_40,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f86a791a9e10f7a;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1df;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x27;
  capturedExpression_41.m_start = "0.0, WithinRel( discrete[0].RICK()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_41,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_41,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e0;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x27;
  capturedExpression_42.m_start = "0.0, WithinRel( discrete[0].RICK()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_42,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_42,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e1;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x46;
  capturedExpression_43.m_start =
       "0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_43,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_43,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e2;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x46;
  capturedExpression_44.m_start =
       "0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_44,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_44,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e3;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x2f;
  capturedExpression_45.m_start = "3.315735e+5, WithinRel( discrete[0].RICL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_45,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_45,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x41143cd600000000;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e4;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x2f;
  capturedExpression_46.m_start = "5.608008e+3, WithinRel( discrete[0].RICL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_46,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_46,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40b5e8020c49ba5e;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e5;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x4e;
  capturedExpression_47.m_start =
       "3.315735e+5, WithinRel( discrete[0].internalConversionCoefficientLShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_47,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_47,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x41143cd600000000;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e6;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x4e;
  capturedExpression_48.m_start =
       "5.608008e+3, WithinRel( discrete[0].internalConversionCoefficientLShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_48,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_48,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40b5e8020c49ba5e;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e7;
  macroName_49.m_size = 5;
  macroName_49.m_start = "CHECK";
  capturedExpression_49.m_size = 0x18;
  capturedExpression_49.m_start = "4. == discrete[1].RTYP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_49,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_49,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       *(chunk->discrete_).
        super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
        ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 4.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x4010000000000000;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e8;
  macroName_50.m_size = 5;
  macroName_50.m_start = "CHECK";
  capturedExpression_50.m_size = 0x1e;
  capturedExpression_50.m_start = "4. == discrete[1].decayChain()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_50,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_50,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       (size_type)
       *(chunk->discrete_).
        super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
        ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 4.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x4010000000000000;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1e9;
  macroName_51.m_size = 5;
  macroName_51.m_start = "CHECK";
  capturedExpression_51.m_size = 0x16;
  capturedExpression_51.m_start = "12 == discrete[1].NT()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_51,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_51,ContinueOnFailure);
  pDVar1 = (chunk->discrete_).
           super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)*(pointer *)
                               ((long)&pDVar1[1].super_ListRecord.data.
                                       super__Vector_base<double,_std::allocator<double>_> + 8) -
                       *(long *)&pDVar1[1].super_ListRecord.data.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data) >> 3);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar3 == 0xc,1);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2e0;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size =
       CONCAT44(0xc,(undefined4)catchAssertionHandler_79.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar3);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ea;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2d;
  capturedExpression_52.m_start = "4.935000e+4, WithinRel( discrete[1].ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_52,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_52,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40e818c000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x28))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1eb;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x2d;
  capturedExpression_53.m_start = "2.000000e+1, WithinRel( discrete[1].ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_53,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_53,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x20))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ec;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x39;
  capturedExpression_54.m_start = "4.935000e+4, WithinRel( discrete[1].discreteEnergy()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_54,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_54,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x40e818c000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<0UL,_double,_false> *)
             ((long)&(chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x28))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ed;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x39;
  capturedExpression_55.m_start = "2.000000e+1, WithinRel( discrete[1].discreteEnergy()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_55,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_55,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_79,
             ((_Head_base<1UL,_double,_false> *)
             ((long)&(chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.metadata.fields +
             0x20))->_M_head_impl);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ee;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x2d;
  capturedExpression_56.m_start = "1.335690e-3, WithinRel( discrete[1].RI()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_56,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_56,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f55e24a3786a9fe;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ef;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x2d;
  capturedExpression_57.m_start = "5.409179e-5, WithinRel( discrete[1].RI()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_57,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_57,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f0c5c13c093e6cd;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f0;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x3c;
  capturedExpression_58.m_start = "1.335690e-3, WithinRel( discrete[1].relativeIntensity()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_58,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_58,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f55e24a3786a9fe;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f1;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x3c;
  capturedExpression_59.m_start = "5.409179e-5, WithinRel( discrete[1].relativeIntensity()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_59,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_59,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f0c5c13c093e6cd;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RI
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f2;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x18;
  capturedExpression_60.m_start = "0. == discrete[1].TYPE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_60,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_60,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       *(size_type *)
        (*(long *)&(chunk->discrete_).
                   super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 499;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x18;
  capturedExpression_61.m_start = "0. == discrete[1].type()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_61,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_61,ContinueOnFailure);
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size =
       *(size_type *)
        (*(long *)&(chunk->discrete_).
                   super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].super_ListRecord.data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((double)catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_size == 0.0,1)
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001df2a0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler_79.m_assertionInfo.lineInfo.line = (size_t)anon_var_dwarf_29a48;
  catchAssertionHandler_79.m_assertionInfo.capturedExpression.m_start = (char *)0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)&catchAssertionHandler_79);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 500;
  macroName_62.m_size = 10;
  macroName_62.m_start = "CHECK_THAT";
  capturedExpression_62.m_size = 0x26;
  capturedExpression_62.m_start = "0.0, WithinRel( discrete[1].RIS()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_62,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_62,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f5;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x26;
  capturedExpression_63.m_start = "0.0, WithinRel( discrete[1].RIS()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_63,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_63,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f6;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x43;
  capturedExpression_64.m_start =
       "0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_64,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_64,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f7;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x43;
  capturedExpression_65.m_start =
       "0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_65,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_65,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RIS
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f8;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x2f;
  capturedExpression_66.m_start = "8.209999e-1, WithinRel( discrete[1].RICC()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_66,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_66,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fea45a195109ddd;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1f9;
  macroName_67.m_size = 10;
  macroName_67.m_start = "CHECK_THAT";
  capturedExpression_67.m_size = 0x2f;
  capturedExpression_67.m_start = "0.000000e+0, WithinRel( discrete[1].RICC()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_67,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_67,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1fa;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x4d;
  capturedExpression_68.m_start =
       "8.209999e-1, WithinRel( discrete[1].totalInternalConversionCoefficient()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_68,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_68,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fea45a195109ddd;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1fb;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x4d;
  capturedExpression_69.m_start =
       "0.000000e+0, WithinRel( discrete[1].totalInternalConversionCoefficient()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_69,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_69,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICC
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1fc;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x27;
  capturedExpression_70.m_start = "0.0, WithinRel( discrete[1].RICK()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_70,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_70,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1fd;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x27;
  capturedExpression_71.m_start = "0.0, WithinRel( discrete[1].RICK()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_71,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_71,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1fe;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x46;
  capturedExpression_72.m_start =
       "0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_72,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_72,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x1ff;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x46;
  capturedExpression_73.m_start =
       "0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_73,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_73,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x0;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICK
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x200;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x2f;
  capturedExpression_74.m_start = "6.160000e-1, WithinRel( discrete[1].RICL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_74,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_74,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fe3b645a1cac083;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x201;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x2f;
  capturedExpression_75.m_start = "8.999999e-3, WithinRel( discrete[1].RICL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_75,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_75,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f826e976af3c76b;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x202;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x4e;
  capturedExpression_76.m_start =
       "6.160000e-1, WithinRel( discrete[1].internalConversionCoefficientLShell()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_76,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_76,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3fe3b645a1cac083;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[0]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  catchAssertionHandler_79.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/8/457/DecaySpectrum/test/DecaySpectrum.test.cpp"
  ;
  catchAssertionHandler_79.m_assertionInfo.macroName.m_size = 0x203;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x4e;
  capturedExpression_77.m_start =
       "8.999999e-3, WithinRel( discrete[1].internalConversionCoefficientLShell()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&continuous,macroName_77,
             (SourceLineInfo *)&catchAssertionHandler_79,capturedExpression_77,ContinueOnFailure);
  local_f0._vptr_ITransientExpression = (_func_int **)0x3f826e976af3c76b;
  aVar4 = njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum::RICL
                    ((chunk->discrete_).
                     super__Vector_base<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum,_std::allocator<njoy::ENDFtk::section::Type<8,_457>::DiscreteSpectrum>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_79,aVar4._M_elems[1]);
  local_120._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_79,(double *)&local_f0);
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df320;
  local_118 = &local_f0;
  local_110[0] = (char *)&catchAssertionHandler_79;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&continuous,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_79);
  Catch::AssertionHandler::complete((AssertionHandler *)&continuous);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&continuous);
  njoy::ENDFtk::TabulationRecord::TabulationRecord(&continuous.super_TabulationRecord,local_38);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x206;
  macroName_78.m_size = 5;
  macroName_78.m_start = "CHECK";
  capturedExpression_78.m_size = 0x17;
  capturedExpression_78.m_start = "4. == continuous.RTYP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_78,(SourceLineInfo *)local_128,
             capturedExpression_78,ContinueOnFailure);
  local_120._1_1_ =
       continuous.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl == 4.0;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df2a0;
  local_118 = (ITransientExpression *)0x4010000000000000;
  local_110[0] = "==";
  local_110[1] = (char *)0x2;
  local_100 = continuous.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Head_base<0UL,_double,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x207;
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  capturedExpression_79.m_size = 0x1d;
  capturedExpression_79.m_start = "4. == continuous.decayChain()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_79,(SourceLineInfo *)local_128,
             capturedExpression_79,ContinueOnFailure);
  local_120._1_1_ =
       continuous.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl == 4.0;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df2a0;
  local_118 = (ITransientExpression *)0x4010000000000000;
  local_110[0] = "==";
  local_110[1] = (char *)0x2;
  local_100 = continuous.super_TabulationRecord.super_InterpolationBase.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Head_base<0UL,_double,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x208;
  macroName_80.m_size = 5;
  macroName_80.m_start = "CHECK";
  capturedExpression_80.m_size = 0x14;
  capturedExpression_80.m_start = "3 == continuous.NP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_80,(SourceLineInfo *)local_128,
             capturedExpression_80,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x209;
  macroName_81.m_size = 5;
  macroName_81.m_start = "CHECK";
  capturedExpression_81.m_size = 0x1e;
  capturedExpression_81.m_start = "3 == continuous.numberPoints()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_81,(SourceLineInfo *)local_128,
             capturedExpression_81,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20a;
  macroName_82.m_size = 5;
  macroName_82.m_start = "CHECK";
  capturedExpression_82.m_size = 0x14;
  capturedExpression_82.m_start = "1 == continuous.NR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_82,(SourceLineInfo *)local_128,
             capturedExpression_82,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20b;
  macroName_83.m_size = 5;
  macroName_83.m_start = "CHECK";
  capturedExpression_83.m_size = 0x2c;
  capturedExpression_83.m_start = "1 == continuous.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_83,(SourceLineInfo *)local_128,
             capturedExpression_83,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20c;
  macroName_84.m_size = 5;
  macroName_84.m_start = "CHECK";
  capturedExpression_84.m_size = 0x1c;
  capturedExpression_84.m_start = "1 == continuous.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_84,(SourceLineInfo *)local_128,
             capturedExpression_84,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20d;
  macroName_85.m_size = 5;
  macroName_85.m_start = "CHECK";
  capturedExpression_85.m_size = 0x1c;
  capturedExpression_85.m_start = "1 == continuous.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_85,(SourceLineInfo *)local_128,
             capturedExpression_85,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20e;
  macroName_86.m_size = 5;
  macroName_86.m_start = "CHECK";
  capturedExpression_86.m_size = 0x18;
  capturedExpression_86.m_start = "1 == continuous.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_86,(SourceLineInfo *)local_128,
             capturedExpression_86,ContinueOnFailure);
  local_110[1] = (char *)*continuous.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  local_120._1_1_ = local_110[1] == (char *)0x1;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x20f;
  macroName_87.m_size = 5;
  macroName_87.m_start = "CHECK";
  capturedExpression_87.m_size = 0x18;
  capturedExpression_87.m_start = "3 == continuous.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_87,(SourceLineInfo *)local_128,
             capturedExpression_87,ContinueOnFailure);
  local_110[1] = (char *)*continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  local_120._1_1_ = local_110[1] == (char *)0x3;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x210;
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  capturedExpression_88.m_size = 0x25;
  capturedExpression_88.m_start = "1 == continuous.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_88,(SourceLineInfo *)local_128,
             capturedExpression_88,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                interpolationSchemeIndices.
                                super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x211;
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  capturedExpression_89.m_size = 0x23;
  capturedExpression_89.m_start = "1 == continuous.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_89,(SourceLineInfo *)local_128,
             capturedExpression_89,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.super_InterpolationBase.
                                boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start == 8;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x212;
  macroName_90.m_size = 5;
  macroName_90.m_start = "CHECK";
  capturedExpression_90.m_size = 0x21;
  capturedExpression_90.m_start = "1 == continuous.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_90,(SourceLineInfo *)local_128,
             capturedExpression_90,ContinueOnFailure);
  local_110[1] = (char *)*continuous.super_TabulationRecord.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  local_120._1_1_ = local_110[1] == (char *)0x1;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 1;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x213;
  macroName_91.m_size = 5;
  macroName_91.m_start = "CHECK";
  capturedExpression_91.m_size = 0x1f;
  capturedExpression_91.m_start = "3 == continuous.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_91,(SourceLineInfo *)local_128,
             capturedExpression_91,ContinueOnFailure);
  local_110[1] = (char *)*continuous.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  local_120._1_1_ = local_110[1] == (char *)0x3;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x214;
  macroName_92.m_size = 5;
  macroName_92.m_start = "CHECK";
  capturedExpression_92.m_size = 0x21;
  capturedExpression_92.m_start = "3 == continuous.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_92,(SourceLineInfo *)local_128,
             capturedExpression_92,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.xValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x215;
  macroName_93.m_size = 5;
  macroName_93.m_start = "CHECK";
  capturedExpression_93.m_size = 0x27;
  capturedExpression_93.m_start = "3 == continuous.spectralValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_93,(SourceLineInfo *)local_128,
             capturedExpression_93,ContinueOnFailure);
  local_110[1] = (char *)((long)continuous.super_TabulationRecord.yValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)continuous.super_TabulationRecord.yValues.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start >> 3);
  local_120._1_1_ =
       (long)continuous.super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)continuous.super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x18;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3f0;
  local_120._4_4_ = 3;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x216;
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  capturedExpression_94.m_size = 0x2a;
  capturedExpression_94.m_start = "0.0, WithinRel( continuous.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_94,(SourceLineInfo *)local_128,
             capturedExpression_94,ContinueOnFailure);
  local_40 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *continuous.super_TabulationRecord.xValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x217;
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  capturedExpression_95.m_size = 0x2b;
  capturedExpression_95.m_start = "5e+5, WithinRel( continuous.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_95,(SourceLineInfo *)local_128,
             capturedExpression_95,ContinueOnFailure);
  local_40 = 500000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x218;
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  capturedExpression_96.m_size = 0x2d;
  capturedExpression_96.m_start = "7.3e+6, WithinRel( continuous.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_96,(SourceLineInfo *)local_128,
             capturedExpression_96,ContinueOnFailure);
  local_40 = 7300000.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             continuous.super_TabulationRecord.xValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x219;
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  capturedExpression_97.m_size = 0x38;
  capturedExpression_97.m_start = "6.133200e-7, WithinRel( continuous.spectralValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_97,(SourceLineInfo *)local_128,
             capturedExpression_97,ContinueOnFailure);
  local_40 = 6.1332e-07;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             *continuous.super_TabulationRecord.yValues.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x21a;
  macroName_98.m_size = 10;
  macroName_98.m_start = "CHECK_THAT";
  capturedExpression_98.m_size = 0x38;
  capturedExpression_98.m_start = "6.133300e-7, WithinRel( continuous.spectralValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_98,(SourceLineInfo *)local_128,
             capturedExpression_98,ContinueOnFailure);
  local_40 = 6.1333e-07;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             continuous.super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[1]);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x21b;
  macroName_99.m_size = 10;
  macroName_99.m_start = "CHECK_THAT";
  capturedExpression_99.m_size = 0x38;
  capturedExpression_99.m_start = "6.02040e-17, WithinRel( continuous.spectralValues()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_99,(SourceLineInfo *)local_128,
             capturedExpression_99,ContinueOnFailure);
  local_40 = 6.0204e-17;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_128,
             continuous.super_TabulationRecord.yValues.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[2]);
  local_f0.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_128,&local_40);
  local_f0.m_isBinaryExpression = true;
  local_f0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001df320;
  local_e0 = &local_40;
  local_d8 = (WithinRelMatcher *)local_128;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,&local_f0);
  Catch::ITransientExpression::~ITransientExpression(&local_f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  local_128 = (undefined1  [8])0x18d514;
  local_120 = (pointer)0x21d;
  macroName_x00100.m_size = 5;
  macroName_x00100.m_start = "CHECK";
  capturedExpression_x00100.m_size = 0x10;
  capturedExpression_x00100.m_start = "11 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_79,macroName_x00100,(SourceLineInfo *)local_128,
             capturedExpression_x00100,ContinueOnFailure);
  local_110[1] = (char *)njoy::ENDFtk::section::Type<8,_457>::DecaySpectrum::NC(chunk);
  local_120._1_1_ = local_110[1] == (char *)0xb;
  local_120._0_1_ = true;
  local_128 = (undefined1  [8])&PTR_streamReconstructedExpression_001df3b0;
  local_120._4_4_ = 0xb;
  local_118 = (ITransientExpression *)0x18faca;
  local_110[0] = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_79,(ITransientExpression *)local_128);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_128);
  Catch::AssertionHandler::complete(&catchAssertionHandler_79);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_79);
  njoy::ENDFtk::TabulationRecord::~TabulationRecord(&continuous.super_TabulationRecord);
  return;
}

Assistant:

void verifyChunkWithLCONTwo( const DecaySpectrum& chunk ) {

  CHECK( 0. == chunk.STYP() );
  CHECK( 0. == chunk.radiationType() );

  CHECK( 2 == chunk.LCON() );
  CHECK( 2 == chunk.spectralTypeFlag() );
  CHECK( 0 == chunk.LCOV() );
  CHECK( 0 == chunk.covarianceFlag() );
  CHECK( 2 == chunk.NER() );
  CHECK( 2 == chunk.numberDiscreteSpectra() );

  CHECK_THAT( 1., WithinRel( chunk.FD()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.FD()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.discreteNormalisationFactor()[0] ) );
  CHECK_THAT( 0., WithinRel( chunk.discreteNormalisationFactor()[1] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.FC()[0] ) );
  CHECK_THAT( 0.25, WithinRel( chunk.FC()[1] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.continuousNormalisationFactor()[0] ) );
  CHECK_THAT( 0.25, WithinRel( chunk.continuousNormalisationFactor()[1] ) );
  CHECK_THAT( 2.107044e+2, WithinRel( chunk.ERAV()[0] ) );
  CHECK_THAT( 1.576284e+1, WithinRel( chunk.ERAV()[1] ) );
  CHECK_THAT( 2.107044e+2, WithinRel( chunk.averageDecayEnergy()[0] ) );
  CHECK_THAT( 1.576284e+1, WithinRel( chunk.averageDecayEnergy()[1] ) );

  CHECK( std::nullopt != chunk.continuousSpectrum() );

  auto discrete = chunk.discreteSpectra();
  CHECK( 3. == discrete[0].RTYP() );
  CHECK( 3. == discrete[0].decayChain() );
  CHECK( 12 == discrete[0].NT() );
  CHECK_THAT( 4.863000e+4, WithinRel( discrete[0].ER()[0] ) );
  CHECK_THAT( 5.000000e+1, WithinRel( discrete[0].ER()[1] ) );
  CHECK_THAT( 4.863000e+4, WithinRel( discrete[0].discreteEnergy()[0] ) );
  CHECK_THAT( 5.000000e+1, WithinRel( discrete[0].discreteEnergy()[1] ) );
  CHECK_THAT( 1.420112e-6, WithinRel( discrete[0].RI()[0] ) );
  CHECK_THAT( 2.85306e-10, WithinRel( discrete[0].RI()[1] ) );
  CHECK_THAT( 1.420112e-6, WithinRel( discrete[0].relativeIntensity()[0] ) );
  CHECK_THAT( 2.85306e-10, WithinRel( discrete[0].relativeIntensity()[1] ) );
  CHECK( 0. == discrete[0].TYPE() );
  CHECK( 0. == discrete[0].type() );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RIS()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RIS()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalPairFormationCoefficient()[1] ) );
  CHECK_THAT( 7.010000e+5, WithinRel( discrete[0].RICC()[0] ) );
  CHECK_THAT( 1.106180e-2, WithinRel( discrete[0].RICC()[1] ) );
  CHECK_THAT( 7.010000e+5, WithinRel( discrete[0].totalInternalConversionCoefficient()[0] ) );
  CHECK_THAT( 1.106180e-2, WithinRel( discrete[0].totalInternalConversionCoefficient()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RICK()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].RICK()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[0].internalConversionCoefficientKShell()[1] ) );
  CHECK_THAT( 3.315735e+5, WithinRel( discrete[0].RICL()[0] ) );
  CHECK_THAT( 5.608008e+3, WithinRel( discrete[0].RICL()[1] ) );
  CHECK_THAT( 3.315735e+5, WithinRel( discrete[0].internalConversionCoefficientLShell()[0] ) );
  CHECK_THAT( 5.608008e+3, WithinRel( discrete[0].internalConversionCoefficientLShell()[1] ) );
  CHECK( 4. == discrete[1].RTYP() );
  CHECK( 4. == discrete[1].decayChain() );
  CHECK( 12 == discrete[1].NT() );
  CHECK_THAT( 4.935000e+4, WithinRel( discrete[1].ER()[0] ) );
  CHECK_THAT( 2.000000e+1, WithinRel( discrete[1].ER()[1] ) );
  CHECK_THAT( 4.935000e+4, WithinRel( discrete[1].discreteEnergy()[0] ) );
  CHECK_THAT( 2.000000e+1, WithinRel( discrete[1].discreteEnergy()[1] ) );
  CHECK_THAT( 1.335690e-3, WithinRel( discrete[1].RI()[0] ) );
  CHECK_THAT( 5.409179e-5, WithinRel( discrete[1].RI()[1] ) );
  CHECK_THAT( 1.335690e-3, WithinRel( discrete[1].relativeIntensity()[0] ) );
  CHECK_THAT( 5.409179e-5, WithinRel( discrete[1].relativeIntensity()[1] ) );
  CHECK( 0. == discrete[1].TYPE() );
  CHECK( 0. == discrete[1].type() );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RIS()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RIS()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalPairFormationCoefficient()[1] ) );
  CHECK_THAT( 8.209999e-1, WithinRel( discrete[1].RICC()[0] ) );
  CHECK_THAT( 0.000000e+0, WithinRel( discrete[1].RICC()[1] ) );
  CHECK_THAT( 8.209999e-1, WithinRel( discrete[1].totalInternalConversionCoefficient()[0] ) );
  CHECK_THAT( 0.000000e+0, WithinRel( discrete[1].totalInternalConversionCoefficient()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RICK()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].RICK()[1] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[0] ) );
  CHECK_THAT( 0.0, WithinRel( discrete[1].internalConversionCoefficientKShell()[1] ) );
  CHECK_THAT( 6.160000e-1, WithinRel( discrete[1].RICL()[0] ) );
  CHECK_THAT( 8.999999e-3, WithinRel( discrete[1].RICL()[1] ) );
  CHECK_THAT( 6.160000e-1, WithinRel( discrete[1].internalConversionCoefficientLShell()[0] ) );
  CHECK_THAT( 8.999999e-3, WithinRel( discrete[1].internalConversionCoefficientLShell()[1] ) );

  ContinuousSpectrum continuous = *( chunk.continuousSpectrum() );
  CHECK( 4. == continuous.RTYP() );
  CHECK( 4. == continuous.decayChain() );
  CHECK( 3 == continuous.NP() );
  CHECK( 3 == continuous.numberPoints() );
  CHECK( 1 == continuous.NR() );
  CHECK( 1 == continuous.numberInterpolationRegions() );
  CHECK( 1 == continuous.INT().size() );
  CHECK( 1 == continuous.NBT().size() );
  CHECK( 1 == continuous.INT()[0] );
  CHECK( 3 == continuous.NBT()[0] );
  CHECK( 1 == continuous.interpolants().size() );
  CHECK( 1 == continuous.boundaries().size() );
  CHECK( 1 == continuous.interpolants()[0] );
  CHECK( 3 == continuous.boundaries()[0] );
  CHECK( 3 == continuous.energies().size() );
  CHECK( 3 == continuous.spectralValues().size() );
  CHECK_THAT( 0.0, WithinRel( continuous.energies()[0] ) );
  CHECK_THAT( 5e+5, WithinRel( continuous.energies()[1] ) );
  CHECK_THAT( 7.3e+6, WithinRel( continuous.energies()[2] ) );
  CHECK_THAT( 6.133200e-7, WithinRel( continuous.spectralValues()[0] ) );
  CHECK_THAT( 6.133300e-7, WithinRel( continuous.spectralValues()[1] ) );
  CHECK_THAT( 6.02040e-17, WithinRel( continuous.spectralValues()[2] ) );

  CHECK( 11 == chunk.NC() );
}